

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void add_new_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  func_cfg_t pfVar1;
  in_edge_t_conflict peVar2;
  out_edge_t peVar3;
  bitmap_t bm;
  bb_insn_t_conflict elem;
  out_edge_t peVar4;
  char *pcVar5;
  uchar uVar6;
  int iVar7;
  bb_t in_RCX;
  bb_insn_t pbVar8;
  DLIST_bb_t *pDVar9;
  bb_t_conflict bb_00;
  bb_t extraout_RDX;
  DLIST_in_edge_t *pDVar10;
  DLIST_out_edge_t *pDVar11;
  DLIST_LINK_in_edge_t *pDVar12;
  DLIST_LINK_out_edge_t *pDVar13;
  DLIST_LINK_bb_insn_t *pDVar14;
  uint uVar15;
  long *nb;
  gen_ctx_t gen_ctx_00;
  bitmap_t pVVar16;
  int in_R8D;
  
  if (bb == (bb_t_conflict)0x0) {
    add_new_bb_cold_3();
LAB_0015ee91:
    add_new_bb_cold_1();
  }
  else {
    pfVar1 = gen_ctx->curr_cfg;
    in_RCX = (pfVar1->bbs).tail;
    if (in_RCX != (bb_t)0x0) {
      if ((in_RCX->bb_link).next == (bb_t)0x0) {
        pDVar9 = (DLIST_bb_t *)&(in_RCX->bb_link).next;
        goto LAB_0015ee65;
      }
      goto LAB_0015ee91;
    }
    pDVar9 = &pfVar1->bbs;
    if (pDVar9->head == (bb_t_conflict)0x0) {
LAB_0015ee65:
      pDVar9->head = bb;
      (bb->bb_link).next = (bb_t)0x0;
      (bb->bb_link).prev = in_RCX;
      (pfVar1->bbs).tail = bb;
      uVar15 = gen_ctx->curr_bb_index;
      gen_ctx->curr_bb_index = uVar15 + 1;
      bb->index = (ulong)uVar15;
      return;
    }
  }
  iVar7 = (int)in_RCX;
  add_new_bb_cold_2();
  elem = create_bb_insn(gen_ctx,(MIR_insn_t)bb,bb_00);
  gen_ctx_00 = (gen_ctx_t)&bb_00->bb_insns;
  if (iVar7 != 0) {
    DLIST_bb_insn_t_append((DLIST_bb_insn_t *)gen_ctx_00,elem);
    return;
  }
  pbVar8 = ((DLIST_bb_insn_t *)gen_ctx_00)->head;
  if (pbVar8 == (bb_insn_t)0x0) {
    if ((bb_00->bb_insns).tail == (bb_insn_t)0x0) {
      pDVar14 = (DLIST_LINK_bb_insn_t *)&(bb_00->bb_insns).tail;
      goto LAB_0015eede;
    }
  }
  else {
    if ((pbVar8->bb_insn_link).prev == (bb_insn_t)0x0) {
      pDVar14 = &pbVar8->bb_insn_link;
LAB_0015eede:
      pDVar14->prev = elem;
      (elem->bb_insn_link).prev = (bb_insn_t)0x0;
      (elem->bb_insn_link).next = pbVar8;
      ((DLIST_bb_insn_t *)gen_ctx_00)->head = elem;
      return;
    }
    add_new_bb_insn_cold_1();
  }
  uVar6 = (uchar)pbVar8;
  add_new_bb_insn_cold_2();
  uVar15 = 0x38;
  peVar4 = (out_edge_t)gen_malloc(gen_ctx_00,0x38);
  peVar4->src = bb;
  peVar4->dst = extraout_RDX;
  if (in_R8D == 0) {
    peVar2 = (extraout_RDX->in_edges).head;
    if (peVar2 != (in_edge_t_conflict)0x0) {
      if ((peVar2->in_link).prev == (in_edge_t)0x0) {
        pDVar12 = &peVar2->in_link;
        goto LAB_0015efcb;
      }
      goto LAB_0015f037;
    }
    if ((extraout_RDX->in_edges).tail == (in_edge_t_conflict)0x0) {
      pDVar12 = (DLIST_LINK_in_edge_t *)&(extraout_RDX->in_edges).tail;
LAB_0015efcb:
      pDVar12->prev = peVar4;
      (peVar4->in_link).prev = (in_edge_t)0x0;
      (peVar4->in_link).next = peVar2;
      (extraout_RDX->in_edges).head = peVar4;
      peVar3 = (bb->out_edges).head;
      if (peVar3 == (out_edge_t)0x0) {
        if ((bb->out_edges).tail != (out_edge_t)0x0) goto LAB_0015f050;
        pDVar13 = (DLIST_LINK_out_edge_t *)&(bb->out_edges).tail;
LAB_0015efff:
        pDVar11 = &bb->out_edges;
        pDVar13->prev = peVar4;
        (peVar4->out_link).prev = (out_edge_t)0x0;
        (peVar4->out_link).next = peVar3;
        goto LAB_0015f012;
      }
      if ((peVar3->out_link).prev == (out_edge_t)0x0) {
        pDVar13 = &peVar3->out_link;
        goto LAB_0015efff;
      }
      goto LAB_0015f046;
    }
  }
  else {
    peVar2 = (extraout_RDX->in_edges).tail;
    if (peVar2 == (in_edge_t_conflict)0x0) {
      if ((extraout_RDX->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0015f03c;
      pDVar10 = &extraout_RDX->in_edges;
LAB_0015ef6b:
      pDVar10->head = peVar4;
      (peVar4->in_link).next = (in_edge_t)0x0;
      (peVar4->in_link).prev = peVar2;
      (extraout_RDX->in_edges).tail = peVar4;
      peVar3 = (bb->out_edges).tail;
      if (peVar3 != (out_edge_t)0x0) {
        if ((peVar3->out_link).next != (out_edge_t)0x0) goto LAB_0015f032;
        pDVar11 = (DLIST_out_edge_t *)&(peVar3->out_link).next;
LAB_0015efa7:
        pDVar11->head = peVar4;
        (peVar4->out_link).next = (out_edge_t)0x0;
        pDVar11 = (DLIST_out_edge_t *)&(bb->out_edges).tail;
        (peVar4->out_link).prev = peVar3;
LAB_0015f012:
        pDVar11->head = peVar4;
        peVar4->fall_through_p = uVar6;
        peVar4->flag2 = '\0';
        peVar4->back_edge_p = '\0';
        peVar4->flag1 = '\0';
        return;
      }
      if ((bb->out_edges).head == (out_edge_t)0x0) {
        pDVar11 = &bb->out_edges;
        goto LAB_0015efa7;
      }
    }
    else {
      if ((peVar2->in_link).next == (in_edge_t)0x0) {
        pDVar10 = (DLIST_in_edge_t *)&(peVar2->in_link).next;
        goto LAB_0015ef6b;
      }
      create_edge_cold_1();
LAB_0015f032:
      create_edge_cold_3();
LAB_0015f037:
      create_edge_cold_5();
LAB_0015f03c:
      create_edge_cold_2();
    }
    create_edge_cold_4();
LAB_0015f046:
    create_edge_cold_7();
  }
  create_edge_cold_6();
LAB_0015f050:
  create_edge_cold_8();
  if (uVar15 < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5f3,"void update_tied_regs(gen_ctx_t, MIR_reg_t)");
  }
  if ((uVar15 != 0xffffffff) &&
     (pcVar5 = MIR_reg_hard_reg_name
                         (gen_ctx_00->ctx,uVar15 - 0x21,(gen_ctx_00->curr_func_item->u).func),
     pcVar5 != (char *)0x0)) {
    bm = gen_ctx_00->tied_regs;
    nb = (long *)((ulong)uVar15 + 1);
    pVVar16 = bm;
    bitmap_expand(bm,(size_t)nb);
    if (bm == (bitmap_t)0x0) {
      update_tied_regs_cold_1();
      if ((*(int *)(pVVar16->els_num + 0x18) == 0xb4) && (*(int *)(*nb + 0x18) == 0xb4)) {
        return;
      }
      __assert_fail("lab1->code == MIR_LABEL && lab2->code == MIR_LABEL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x60c,"int label_cmp(const void *, const void *)");
    }
    bm->varr[uVar15 >> 6] = bm->varr[uVar15 >> 6] | 1L << ((ulong)uVar15 & 0x3f);
  }
  return;
}

Assistant:

static void add_new_bb (gen_ctx_t gen_ctx, bb_t bb) {
  DLIST_APPEND (bb_t, curr_cfg->bbs, bb);
  bb->index = curr_bb_index++;
}